

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

int testing::internal::anon_unknown_91::ReadProcFileField<int>(string *filename,int field)

{
  int iVar1;
  undefined8 uVar2;
  int in_ESI;
  int output;
  ifstream file;
  string dummy;
  int local_248 [4];
  istream local_238 [520];
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::string::string(local_30);
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_238,uVar2,8);
  while (0 < local_c) {
    local_c = local_c + -1;
    std::operator>>(local_238,local_30);
  }
  local_248[0] = 0;
  local_c = local_c + -1;
  std::istream::operator>>(local_238,local_248);
  iVar1 = local_248[0];
  std::ifstream::~ifstream(local_238);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

T ReadProcFileField(const std::string& filename, int field) {
  std::string dummy;
  std::ifstream file(filename.c_str());
  while (field-- > 0) {
    file >> dummy;
  }
  T output = 0;
  file >> output;
  return output;
}